

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Reader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP3Reader::PerformGets(BP3Reader *this)

{
  _Rb_tree_node_base *name;
  BP3Deserializer *this_00;
  long lVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  pointer pBVar7;
  pointer pBVar8;
  pointer pBVar9;
  pointer pBVar10;
  pointer pBVar11;
  pointer pBVar12;
  pointer pBVar13;
  pointer pBVar14;
  pointer pBVar15;
  pointer pBVar16;
  DataType DVar17;
  int iVar18;
  Variable<signed_char> *variable;
  Variable<char> *variable_00;
  Variable<std::complex<float>_> *variable_01;
  Variable<unsigned_char> *variable_02;
  Variable<std::complex<double>_> *variable_03;
  Variable<double> *variable_04;
  Variable<int> *variable_05;
  Variable<long> *variable_06;
  Variable<unsigned_long> *variable_07;
  Variable<short> *variable_08;
  Variable<unsigned_short> *variable_09;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable_10;
  Variable<unsigned_int> *variable_11;
  Variable<long_double> *variable_12;
  Variable<float> *variable_13;
  _Rb_tree_node_base *p_Var19;
  BPInfo *blockInfo;
  pointer blockInfo_00;
  pointer blockInfo_01;
  pointer blockInfo_02;
  pointer blockInfo_03;
  pointer blockInfo_04;
  pointer blockInfo_05;
  pointer blockInfo_06;
  pointer blockInfo_07;
  pointer blockInfo_08;
  pointer blockInfo_09;
  pointer blockInfo_10;
  pointer blockInfo_11;
  pointer blockInfo_12;
  pointer blockInfo_13;
  pointer blockInfo_14;
  ScopedTimer __var2110;
  allocator local_229;
  BP3Reader *local_228;
  ScopedTimer local_220;
  _Rb_tree_node_base *local_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_228 = this;
  if ((PerformGets()::__var110 == '\0') &&
     (iVar18 = __cxa_guard_acquire(&PerformGets()::__var110), iVar18 != 0)) {
    PerformGets::__var110 = (void *)ps_timer_create_("BP3Reader::PerformGets");
    __cxa_guard_release(&PerformGets()::__var110);
    this = local_228;
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&local_220,PerformGets::__var110);
  lVar1 = *(long *)(*(long *)&(this->m_BP3Deserializer).field_0x0 + -0x18);
  if (*(long *)(&(this->m_BP3Deserializer).field_0x390 + lVar1) != 0) {
    this_00 = &this->m_BP3Deserializer;
    local_218 = (_Rb_tree_node_base *)(&(this->m_BP3Deserializer).field_0x370 + lVar1);
    for (p_Var19 = *(_Rb_tree_node_base **)(&(this->m_BP3Deserializer).field_0x380 + lVar1);
        p_Var19 != local_218; p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
      name = p_Var19 + 1;
      DVar17 = IO::InquireVariableType((this->super_Engine).m_IO,(string *)name);
      switch(DVar17) {
      case Int8:
        std::__cxx11::string::string
                  ((string *)&local_90,"in call to PerformGets, EndStep or Close",&local_229);
        variable = Engine::FindVariable<signed_char>(&this->super_Engine,(string *)name,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        pBVar2 = (variable->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_00 = (variable->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_00 != pBVar2;
            blockInfo_00 = blockInfo_00 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<signed_char>
                    (this_00,variable,blockInfo_00);
        }
        ReadVariableBlocks<signed_char>(local_228,variable);
        std::
        vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
        ::clear(&variable->m_BlocksInfo);
        this = local_228;
        break;
      case Int16:
        std::__cxx11::string::string
                  ((string *)&local_b0,"in call to PerformGets, EndStep or Close",&local_229);
        variable_08 = Engine::FindVariable<short>(&this->super_Engine,(string *)name,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        pBVar11 = (variable_08->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_09 = (variable_08->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_09 != pBVar11;
            blockInfo_09 = blockInfo_09 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<short>
                    (this_00,variable_08,blockInfo_09);
        }
        ReadVariableBlocks<short>(local_228,variable_08);
        std::
        vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
        ::clear(&variable_08->m_BlocksInfo);
        this = local_228;
        break;
      case Int32:
        std::__cxx11::string::string
                  ((string *)&local_d0,"in call to PerformGets, EndStep or Close",&local_229);
        variable_05 = Engine::FindVariable<int>(&this->super_Engine,(string *)name,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        pBVar8 = (variable_05->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_06 = (variable_05->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_06 != pBVar8;
            blockInfo_06 = blockInfo_06 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<int>
                    (this_00,variable_05,blockInfo_06);
        }
        ReadVariableBlocks<int>(local_228,variable_05);
        std::
        vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
        ::clear(&variable_05->m_BlocksInfo);
        this = local_228;
        break;
      case Int64:
        std::__cxx11::string::string
                  ((string *)&local_f0,"in call to PerformGets, EndStep or Close",&local_229);
        variable_06 = Engine::FindVariable<long>(&this->super_Engine,(string *)name,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        pBVar9 = (variable_06->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_07 = (variable_06->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_07 != pBVar9;
            blockInfo_07 = blockInfo_07 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<long>
                    (this_00,variable_06,blockInfo_07);
        }
        ReadVariableBlocks<long>(local_228,variable_06);
        std::
        vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
        ::clear(&variable_06->m_BlocksInfo);
        this = local_228;
        break;
      case UInt8:
        std::__cxx11::string::string
                  ((string *)&local_110,"in call to PerformGets, EndStep or Close",&local_229);
        variable_02 = Engine::FindVariable<unsigned_char>
                                (&this->super_Engine,(string *)name,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        pBVar5 = (variable_02->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_03 = (variable_02->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_03 != pBVar5;
            blockInfo_03 = blockInfo_03 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<unsigned_char>
                    (this_00,variable_02,blockInfo_03);
        }
        ReadVariableBlocks<unsigned_char>(local_228,variable_02);
        std::
        vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
        ::clear(&variable_02->m_BlocksInfo);
        this = local_228;
        break;
      case UInt16:
        std::__cxx11::string::string
                  ((string *)&local_130,"in call to PerformGets, EndStep or Close",&local_229);
        variable_09 = Engine::FindVariable<unsigned_short>
                                (&this->super_Engine,(string *)name,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        pBVar12 = (variable_09->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_10 = (variable_09->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_10 != pBVar12;
            blockInfo_10 = blockInfo_10 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<unsigned_short>
                    (this_00,variable_09,blockInfo_10);
        }
        ReadVariableBlocks<unsigned_short>(local_228,variable_09);
        std::
        vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
        ::clear(&variable_09->m_BlocksInfo);
        this = local_228;
        break;
      case UInt32:
        std::__cxx11::string::string
                  ((string *)&local_150,"in call to PerformGets, EndStep or Close",&local_229);
        variable_11 = Engine::FindVariable<unsigned_int>
                                (&this->super_Engine,(string *)name,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        pBVar14 = (variable_11->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_12 = (variable_11->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_12 != pBVar14;
            blockInfo_12 = blockInfo_12 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<unsigned_int>
                    (this_00,variable_11,blockInfo_12);
        }
        ReadVariableBlocks<unsigned_int>(local_228,variable_11);
        std::
        vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
        ::clear(&variable_11->m_BlocksInfo);
        this = local_228;
        break;
      case UInt64:
        std::__cxx11::string::string
                  ((string *)&local_170,"in call to PerformGets, EndStep or Close",&local_229);
        variable_07 = Engine::FindVariable<unsigned_long>
                                (&this->super_Engine,(string *)name,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        pBVar10 = (variable_07->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_08 = (variable_07->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_08 != pBVar10;
            blockInfo_08 = blockInfo_08 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<unsigned_long>
                    (this_00,variable_07,blockInfo_08);
        }
        ReadVariableBlocks<unsigned_long>(local_228,variable_07);
        std::
        vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
        ::clear(&variable_07->m_BlocksInfo);
        this = local_228;
        break;
      case Float:
        std::__cxx11::string::string
                  ((string *)&local_190,"in call to PerformGets, EndStep or Close",&local_229);
        variable_13 = Engine::FindVariable<float>(&this->super_Engine,(string *)name,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        pBVar16 = (variable_13->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_14 = (variable_13->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_14 != pBVar16;
            blockInfo_14 = blockInfo_14 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<float>
                    (this_00,variable_13,blockInfo_14);
        }
        ReadVariableBlocks<float>(local_228,variable_13);
        std::
        vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
        ::clear(&variable_13->m_BlocksInfo);
        this = local_228;
        break;
      case Double:
        std::__cxx11::string::string
                  ((string *)&local_1b0,"in call to PerformGets, EndStep or Close",&local_229);
        variable_04 = Engine::FindVariable<double>(&this->super_Engine,(string *)name,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        pBVar7 = (variable_04->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_05 = (variable_04->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_05 != pBVar7;
            blockInfo_05 = blockInfo_05 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<double>
                    (this_00,variable_04,blockInfo_05);
        }
        ReadVariableBlocks<double>(local_228,variable_04);
        std::
        vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
        ::clear(&variable_04->m_BlocksInfo);
        this = local_228;
        break;
      case LongDouble:
        std::__cxx11::string::string
                  ((string *)&local_1d0,"in call to PerformGets, EndStep or Close",&local_229);
        variable_12 = Engine::FindVariable<long_double>
                                (&this->super_Engine,(string *)name,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        pBVar15 = (variable_12->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_13 = (variable_12->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_13 != pBVar15;
            blockInfo_13 = blockInfo_13 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<long_double>
                    (this_00,variable_12,blockInfo_13);
        }
        ReadVariableBlocks<long_double>(local_228,variable_12);
        std::
        vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
        ::clear(&variable_12->m_BlocksInfo);
        this = local_228;
        break;
      case FloatComplex:
        std::__cxx11::string::string
                  ((string *)&local_1f0,"in call to PerformGets, EndStep or Close",&local_229);
        variable_01 = Engine::FindVariable<std::complex<float>>
                                (&this->super_Engine,(string *)name,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        pBVar4 = (variable_01->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_02 = (variable_01->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_02 != pBVar4;
            blockInfo_02 = blockInfo_02 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<std::complex<float>>
                    (this_00,variable_01,blockInfo_02);
        }
        ReadVariableBlocks<std::complex<float>>(local_228,variable_01);
        std::
        vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
        ::clear(&variable_01->m_BlocksInfo);
        this = local_228;
        break;
      case DoubleComplex:
        std::__cxx11::string::string
                  ((string *)&local_210,"in call to PerformGets, EndStep or Close",&local_229);
        variable_03 = Engine::FindVariable<std::complex<double>>
                                (&this->super_Engine,(string *)name,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        pBVar6 = (variable_03->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_04 = (variable_03->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_04 != pBVar6;
            blockInfo_04 = blockInfo_04 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<std::complex<double>>
                    (this_00,variable_03,blockInfo_04);
        }
        ReadVariableBlocks<std::complex<double>>(local_228,variable_03);
        std::
        vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
        ::clear(&variable_03->m_BlocksInfo);
        this = local_228;
        break;
      case String:
        std::__cxx11::string::string
                  ((string *)&local_50,"in call to PerformGets, EndStep or Close",&local_229);
        variable_10 = Engine::FindVariable<std::__cxx11::string>
                                (&this->super_Engine,(string *)name,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        pBVar13 = (variable_10->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_11 = (variable_10->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_11 != pBVar13;
            blockInfo_11 = blockInfo_11 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<std::__cxx11::string>
                    (this_00,variable_10,blockInfo_11);
        }
        ReadVariableBlocks<std::__cxx11::string>(local_228,variable_10);
        std::
        vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
        ::clear(&variable_10->m_BlocksInfo);
        this = local_228;
        break;
      case Char:
        std::__cxx11::string::string
                  ((string *)&local_70,"in call to PerformGets, EndStep or Close",&local_229);
        variable_00 = Engine::FindVariable<char>(&this->super_Engine,(string *)name,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        pBVar3 = (variable_00->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (blockInfo_01 = (variable_00->m_BlocksInfo).
                            super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start; blockInfo_01 != pBVar3;
            blockInfo_01 = blockInfo_01 + 1) {
          adios2::format::BP3Deserializer::SetVariableBlockInfo<char>
                    (this_00,variable_00,blockInfo_01);
        }
        ReadVariableBlocks<char>(local_228,variable_00);
        std::
        vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
        ::clear(&variable_00->m_BlocksInfo);
        this = local_228;
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(&this_00->field_0x368 + *(long *)(*(long *)this_00 + -0x18)));
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_220);
  return;
}

Assistant:

void BP3Reader::PerformGets()
{
    PERFSTUBS_SCOPED_TIMER("BP3Reader::PerformGets");
    if (m_BP3Deserializer.m_DeferredVariables.empty())
    {
        return;
    }

    for (const std::string &name : m_BP3Deserializer.m_DeferredVariables)
    {
        const DataType type = m_IO.InquireVariableType(name);

        if (type == DataType::Struct)
        {
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> &variable = FindVariable<T>(name, "in call to PerformGets, EndStep or Close"); \
        for (auto &blockInfo : variable.m_BlocksInfo)                                              \
        {                                                                                          \
            m_BP3Deserializer.SetVariableBlockInfo(variable, blockInfo);                           \
        }                                                                                          \
        ReadVariableBlocks(variable);                                                              \
        variable.m_BlocksInfo.clear();                                                             \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    }

    m_BP3Deserializer.m_DeferredVariables.clear();
}